

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

vector<float,_std::allocator<float>_> * __thiscall
delta_complex_t::vertex_filtration
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,delta_complex_t *this)

{
  pointer pvVar1;
  pointer pdVar2;
  iterator __position;
  pointer pdVar3;
  delta_complex_cell_t c;
  float local_11c;
  delta_complex_cell_t local_118;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = (this->cells).
           super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar3 = *(pointer *)
            &(pvVar1->
             super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>).
             _M_impl;
  pdVar2 = *(pointer *)
            ((long)&(pvVar1->
                    super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>)
                    ._M_impl + 8);
  if (pdVar3 != pdVar2) {
    do {
      delta_complex_cell_t::delta_complex_cell_t(&local_118,pdVar3);
      local_11c = local_118.filt;
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (__return_storage_ptr__,__position,&local_11c);
      }
      else {
        *__position._M_current = local_118.filt;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      std::
      _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_118.in_or_out._M_h);
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      ~_Rb_tree(&local_118.neighbours._M_t);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector(&local_118.orientation);
      if (local_118.vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_118.vertices.super__Vector_base<long,_std::allocator<long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.vertices.super__Vector_base<long,_std::allocator<long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_118.boundary.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.boundary.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_118.boundary.super__Vector_base<long,_std::allocator<long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.boundary.super__Vector_base<long,_std::allocator<long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pdVar3 = pdVar3 + 1;
    } while (pdVar3 != pdVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<value_t> vertex_filtration(){
		std::vector<value_t> out;
		for( auto c : cells[0] ){
			out.push_back(c.filtration());
		}
        return out;
    }